

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O1

char * ngx_http_rewrite_if(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  char cVar1;
  byte bVar2;
  size_t *psVar3;
  ngx_http_core_loc_conf_t *clcf;
  ngx_uint_t nVar4;
  ulong uVar5;
  size_t sVar6;
  u_char *puVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  void *pvVar10;
  ngx_module_t *pnVar11;
  long lVar12;
  ngx_int_t nVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  undefined8 *puVar17;
  ngx_http_regex_t *pnVar18;
  code *pcVar19;
  ulong uVar20;
  long lVar21;
  ngx_conf_t *pnVar22;
  undefined8 *puVar23;
  ngx_str_t *value;
  undefined8 *puVar24;
  char *pcVar25;
  bool bVar26;
  byte bVar27;
  undefined8 local_4a8;
  ngx_conf_t save;
  undefined1 auStack_a8 [8];
  ngx_regex_compile_t rc;
  
  bVar27 = 0;
  puVar9 = (undefined8 *)ngx_pcalloc(cf->pool,0x18);
  pcVar25 = (char *)0xffffffffffffffff;
  if (puVar9 == (undefined8 *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  puVar17 = (undefined8 *)cf->ctx;
  *puVar9 = *puVar17;
  puVar9[1] = puVar17[1];
  pvVar10 = ngx_pcalloc(cf->pool,ngx_http_max_module << 3);
  puVar9[2] = pvVar10;
  if (pvVar10 == (void *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  pnVar11 = *cf->cycle->modules;
  if (pnVar11 != (ngx_module_t *)0x0) {
    lVar21 = 0;
    do {
      if ((pnVar11->type == 0x50545448) &&
         (pcVar19 = *(code **)((long)pnVar11->ctx + 0x30), pcVar19 != (code *)0x0)) {
        lVar12 = (*pcVar19)(cf);
        if (lVar12 == 0) {
          return (char *)0xffffffffffffffff;
        }
        *(long *)(puVar9[2] + **(long **)((long)cf->cycle->modules + lVar21) * 8) = lVar12;
      }
      pnVar11 = *(ngx_module_t **)((long)cf->cycle->modules + lVar21 + 8);
      lVar21 = lVar21 + 8;
    } while (pnVar11 != (ngx_module_t *)0x0);
  }
  psVar3 = *(size_t **)(puVar17[2] + ngx_http_core_module.ctx_index * 8);
  clcf = (ngx_http_core_loc_conf_t *)((void **)puVar9[2])[ngx_http_core_module.ctx_index];
  clcf->loc_conf = (void **)puVar9[2];
  puVar7 = (u_char *)psVar3[1];
  (clcf->name).len = *psVar3;
  (clcf->name).data = puVar7;
  clcf->field_0x18 = clcf->field_0x18 | 1;
  nVar13 = ngx_http_add_location(cf,(ngx_queue_t **)(psVar3 + 0x53),clcf);
  if (nVar13 != 0) {
    return (char *)0xffffffffffffffff;
  }
  pvVar10 = cf->args->elts;
  lVar21 = *(long *)((long)pvVar10 + 0x10);
  if ((lVar21 == 0) || (**(char **)((long)pvVar10 + 0x18) != '(')) {
    value = (ngx_str_t *)((long)pvVar10 + 0x10);
    pcVar15 = "invalid condition \"%V\"";
LAB_0016cfb6:
    ngx_conf_log_error(1,cf,0,pcVar15,value);
  }
  else {
    nVar4 = cf->args->nelts;
    lVar12 = nVar4 - 1;
    lVar14 = 2;
    if (lVar21 != 1) {
      *(long *)((long)pvVar10 + 0x10) = lVar21 + -1;
      *(char **)((long)pvVar10 + 0x18) = *(char **)((long)pvVar10 + 0x18) + 1;
      lVar14 = 1;
    }
    value = (ngx_str_t *)(lVar12 * 0x10 + (long)pvVar10);
    lVar21 = *(long *)((long)pvVar10 + lVar12 * 0x10);
    if ((lVar21 == 0) || (value->data[lVar21 + -1] != ')')) {
LAB_0016cfa5:
      pcVar15 = "invalid condition \"%V\"";
      goto LAB_0016cfb6;
    }
    if (lVar21 == 1) {
      lVar12 = nVar4 - 2;
    }
    else {
      value->len = lVar21 - 1;
      value->data[lVar21 + -1] = '\0';
    }
    uVar20 = (ulong)(uint)((int)lVar14 << 4);
    value = (ngx_str_t *)(uVar20 + (long)pvVar10);
    uVar5 = *(ulong *)((long)pvVar10 + uVar20);
    pcVar15 = *(char **)((long)pvVar10 + uVar20 + 8);
    if ((uVar5 < 2) || (*pcVar15 != '$')) {
      if (uVar5 == 3) {
        if (*pcVar15 == '!') {
          cVar1 = pcVar15[1];
          goto joined_r0x0016cf09;
        }
      }
      else if (uVar5 == 2) {
        cVar1 = *pcVar15;
joined_r0x0016cf09:
        if ((cVar1 == '-') && (lVar14 + 1 == lVar12)) {
          lVar12 = lVar12 * 0x10;
          *(undefined1 *)(*(long *)((long)pvVar10 + lVar12 + 8) + *(long *)((long)pvVar10 + lVar12))
               = 0;
          *(long *)((long)pvVar10 + lVar12) = *(long *)((long)pvVar10 + lVar12) + 1;
          pcVar16 = ngx_http_rewrite_value
                              (cf,(ngx_http_rewrite_loc_conf_t *)conf,
                               (ngx_str_t *)(lVar12 + (long)pvVar10));
          lVar21 = -1;
          if (pcVar16 != (char *)0x0) goto LAB_0016cfc4;
          puVar17 = (undefined8 *)ngx_http_script_start_code(cf->pool,(ngx_array_t **)conf,0x10);
          if (puVar17 == (undefined8 *)0x0) goto LAB_0016cfbd;
          *puVar17 = ngx_http_script_file_code;
          bVar2 = pcVar15[1];
          if (bVar2 < 0x66) {
            if (bVar2 == 100) {
              puVar17[1] = 2;
            }
            else {
              if (bVar2 != 0x65) {
LAB_0016d2ff:
                if (*pcVar15 == '!') {
                  bVar2 = pcVar15[2];
                  if (bVar2 < 0x66) {
                    if (bVar2 == 100) {
                      puVar17[1] = 3;
                    }
                    else {
                      if (bVar2 != 0x65) goto LAB_0016d352;
                      puVar17[1] = 5;
                    }
                  }
                  else if (bVar2 == 0x78) {
                    puVar17[1] = 7;
                  }
                  else {
                    if (bVar2 != 0x66) goto LAB_0016d352;
                    puVar17[1] = 1;
                  }
                  lVar21 = 0;
                  goto LAB_0016cfc4;
                }
LAB_0016d352:
                ngx_conf_log_error(1,cf,0,"invalid condition \"%V\"",value);
                goto LAB_0016cfbd;
              }
              puVar17[1] = 4;
            }
          }
          else if (bVar2 == 0x78) {
            puVar17[1] = 6;
          }
          else {
            if (bVar2 != 0x66) goto LAB_0016d2ff;
            puVar17[1] = 0;
          }
          goto LAB_0016d337;
        }
      }
      goto LAB_0016cfa5;
    }
    if (lVar14 + 2 != lVar12 && lVar14 != lVar12) goto LAB_0016cfa5;
    pcVar15 = ngx_http_rewrite_variable(cf,(ngx_http_rewrite_loc_conf_t *)conf,value);
    if (lVar14 == lVar12 || pcVar15 != (char *)0x0) {
      lVar21 = -(ulong)(pcVar15 != (char *)0x0);
      goto LAB_0016cfc4;
    }
    sVar6 = value[1].len;
    puVar7 = value[1].data;
    if ((sVar6 == 1) && (*puVar7 == '=')) {
      pcVar15 = ngx_http_rewrite_value
                          (cf,(ngx_http_rewrite_loc_conf_t *)conf,
                           (ngx_str_t *)((long)pvVar10 + lVar12 * 0x10));
      lVar21 = -1;
      if (pcVar15 != (char *)0x0) goto LAB_0016cfc4;
      puVar17 = (undefined8 *)ngx_http_script_start_code(cf->pool,(ngx_array_t **)conf,8);
      lVar21 = -1;
      if (puVar17 == (undefined8 *)0x0) goto LAB_0016cfc4;
      pcVar19 = ngx_http_script_equal_code;
LAB_0016d185:
      *puVar17 = pcVar19;
LAB_0016d337:
      lVar21 = 0;
      goto LAB_0016cfc4;
    }
    if (((sVar6 != 2) || (*puVar7 != '!')) || (puVar7[1] != '=')) {
      if ((sVar6 == 1) && (*puVar7 == '~')) goto LAB_0016d1e2;
      if (sVar6 == 2) {
        if (*puVar7 == '!') {
          if (puVar7[1] != '~') goto LAB_0016d1bb;
        }
        else if ((*puVar7 != '~') || (puVar7[1] != '*')) goto LAB_0016d1bb;
      }
      else {
LAB_0016d1bb:
        if ((sVar6 != 3) || (((*puVar7 != '!' || (puVar7[1] != '~')) || (puVar7[2] != '*')))) {
          value = value + 1;
          pcVar15 = "unexpected \"%V\" in condition";
          goto LAB_0016cfb6;
        }
      }
LAB_0016d1e2:
      puVar17 = (undefined8 *)ngx_http_script_start_code(cf->pool,(ngx_array_t **)conf,0x48);
      lVar21 = -1;
      if (puVar17 == (undefined8 *)0x0) goto LAB_0016cfc4;
      puVar17[6] = 0;
      puVar17[7] = 0;
      puVar17[4] = 0;
      puVar17[5] = 0;
      puVar17[2] = 0;
      puVar17[3] = 0;
      *puVar17 = 0;
      puVar17[1] = 0;
      puVar17[8] = 0;
      rc.captures = 0;
      rc.named_captures = 0;
      rc.name_size = 0;
      rc._52_4_ = 0;
      rc.options = 0;
      rc.regex = (ngx_regex_t *)0x0;
      rc.pattern.data = (u_char *)0x0;
      psVar3 = (size_t *)((long)pvVar10 + lVar12 * 0x10);
      auStack_a8 = (undefined1  [8])*psVar3;
      rc.pattern.len = psVar3[1];
      rc.pool = (ngx_pool_t *)(ulong)(puVar7[sVar6 - 1] == '*');
      rc.names = (u_char *)0x400;
      rc.err.len = (size_t)&local_4a8;
      pnVar18 = ngx_http_regex_compile(cf,(ngx_regex_compile_t *)auStack_a8);
      lVar21 = -1;
      puVar17[1] = pnVar18;
      if (pnVar18 == (ngx_http_regex_t *)0x0) goto LAB_0016cfc4;
      puVar24 = (undefined8 *)((long)pvVar10 + lVar12 * 0x10);
      *puVar17 = ngx_http_script_regex_start_code;
      puVar17[5] = 0x48;
      bVar2 = *(byte *)(puVar17 + 6);
      *(byte *)(puVar17 + 6) = bVar2 | 1;
      if (*puVar7 == '!') {
        *(byte *)(puVar17 + 6) = bVar2 | 3;
      }
      uVar8 = puVar24[1];
      puVar17[7] = *puVar24;
      puVar17[8] = uVar8;
      goto LAB_0016d337;
    }
    pcVar15 = ngx_http_rewrite_value
                        (cf,(ngx_http_rewrite_loc_conf_t *)conf,
                         (ngx_str_t *)((long)pvVar10 + lVar12 * 0x10));
    if (pcVar15 == (char *)0x0) {
      puVar17 = (undefined8 *)ngx_http_script_start_code(cf->pool,(ngx_array_t **)conf,8);
      lVar21 = -1;
      if (puVar17 == (undefined8 *)0x0) goto LAB_0016cfc4;
      pcVar19 = ngx_http_script_not_equal_code;
      goto LAB_0016d185;
    }
  }
LAB_0016cfbd:
  lVar21 = -1;
LAB_0016cfc4:
  if ((lVar21 == 0) &&
     (puVar17 = (undefined8 *)ngx_array_push_n(*conf,0x18), puVar17 != (undefined8 *)0x0)) {
    *puVar17 = ngx_http_script_if_code;
    lVar21 = **conf;
    lVar12 = puVar9[2];
    puVar24 = *(undefined8 **)(lVar12 + ngx_http_rewrite_module.ctx_index * 8);
    *puVar24 = *conf;
    pnVar22 = cf;
    puVar23 = &local_4a8;
    for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar23 = pnVar22->name;
      pnVar22 = (ngx_conf_t *)((long)pnVar22 + (ulong)bVar27 * -0x10 + 8);
      puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
    }
    cf->ctx = puVar9;
    bVar26 = cf->cmd_type != 0x4000000;
    if (!bVar26) {
      lVar12 = 0;
    }
    puVar17[2] = lVar12;
    cf->cmd_type = (ulong)((uint)bVar26 << 0x1d) + 0x20000000;
    pcVar25 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
    puVar9 = &local_4a8;
    for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
      cf->name = (char *)*puVar9;
      puVar9 = puVar9 + (ulong)bVar27 * -2 + 1;
      cf = (ngx_conf_t *)((long)cf + (ulong)bVar27 * -0x10 + 8);
    }
    if (pcVar25 == (char *)0x0) {
      lVar12 = **conf;
      pcVar25 = (char *)0x0;
      pcVar15 = (char *)(lVar12 - lVar21);
      if (pcVar15 == (char *)0x0) {
        pcVar15 = pcVar25;
      }
      *(long *)((long)(puVar17 + 1) + (long)pcVar15) =
           (lVar12 + (*conf)[1]) - (long)((long)puVar17 + (long)pcVar15);
      *puVar24 = 0;
    }
  }
  return pcVar25;
}

Assistant:

static char *
ngx_http_rewrite_if(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_rewrite_loc_conf_t  *lcf = conf;

    void                         *mconf;
    char                         *rv;
    u_char                       *elts;
    ngx_uint_t                    i;
    ngx_conf_t                    save;
    ngx_http_module_t            *module;
    ngx_http_conf_ctx_t          *ctx, *pctx;
    ngx_http_core_loc_conf_t     *clcf, *pclcf;
    ngx_http_script_if_code_t    *if_code;
    ngx_http_rewrite_loc_conf_t  *nlcf;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_http_conf_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    pctx = cf->ctx;
    ctx->main_conf = pctx->main_conf;
    ctx->srv_conf = pctx->srv_conf;

    ctx->loc_conf = ngx_pcalloc(cf->pool, sizeof(void *) * ngx_http_max_module);
    if (ctx->loc_conf == NULL) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; cf->cycle->modules[i]; i++) {
        if (cf->cycle->modules[i]->type != NGX_HTTP_MODULE) {
            continue;
        }

        module = cf->cycle->modules[i]->ctx;

        if (module->create_loc_conf) {

            mconf = module->create_loc_conf(cf);
            if (mconf == NULL) {
                return NGX_CONF_ERROR;
            }

            ctx->loc_conf[cf->cycle->modules[i]->ctx_index] = mconf;
        }
    }

    pclcf = pctx->loc_conf[ngx_http_core_module.ctx_index];

    clcf = ctx->loc_conf[ngx_http_core_module.ctx_index];
    clcf->loc_conf = ctx->loc_conf;
    clcf->name = pclcf->name;
    clcf->noname = 1;

    if (ngx_http_add_location(cf, &pclcf->locations, clcf) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    if (ngx_http_rewrite_if_condition(cf, lcf) != NGX_CONF_OK) {
        return NGX_CONF_ERROR;
    }

    if_code = ngx_array_push_n(lcf->codes, sizeof(ngx_http_script_if_code_t));
    if (if_code == NULL) {
        return NGX_CONF_ERROR;
    }

    if_code->code = ngx_http_script_if_code;

    elts = lcf->codes->elts;


    /* the inner directives must be compiled to the same code array */

    nlcf = ctx->loc_conf[ngx_http_rewrite_module.ctx_index];
    nlcf->codes = lcf->codes;


    save = *cf;
    cf->ctx = ctx;

    if (cf->cmd_type == NGX_HTTP_SRV_CONF) {
        if_code->loc_conf = NULL;
        cf->cmd_type = NGX_HTTP_SIF_CONF;

    } else {
        if_code->loc_conf = ctx->loc_conf;
        cf->cmd_type = NGX_HTTP_LIF_CONF;
    }

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }


    if (elts != lcf->codes->elts) {
        if_code = (ngx_http_script_if_code_t *)
                   ((u_char *) if_code + ((u_char *) lcf->codes->elts - elts));
    }

    if_code->next = (u_char *) lcf->codes->elts + lcf->codes->nelts
                                                - (u_char *) if_code;

    /* the code array belong to parent block */

    nlcf->codes = NULL;

    return NGX_CONF_OK;
}